

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O1

Variant * __thiscall Jinx::Variant::operator--(Variant *this)

{
  if (this->m_type == Integer) {
    (this->field_1).m_collection.
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)((this->field_1).m_integer + -1);
  }
  else if (this->m_type == Number) {
    (this->field_1).m_number = (this->field_1).m_number + -1.0;
    return this;
  }
  return this;
}

Assistant:

inline_t Variant & Variant::operator --()
	{
		switch (m_type)
		{
			case ValueType::Number:
				--m_number;
				break;
			case ValueType::Integer:
				--m_integer;
				break;
			default:
				break;
		};
		return *this;
	}